

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

Aig_Man_t * Saig_ManCexMinDupWithCubes(Aig_Man_t *pAig,Vec_Vec_t *vReg2Value)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *p1;
  Vec_Int_t *p_01;
  int local_40;
  int Lit;
  int k;
  int i;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  Vec_Int_t *vLevel;
  Vec_Vec_t *vReg2Value_local;
  Aig_Man_t *pAig_local;
  
  if (pAig->nConstrs != 0) {
    __assert_fail("pAig->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                  ,500,"Aig_Man_t *Saig_ManCexMinDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
  }
  iVar1 = Aig_ManNodeNum(pAig);
  iVar2 = Vec_VecSizeSize(vReg2Value);
  iVar3 = Vec_VecSize(vReg2Value);
  p_00 = Aig_ManStart(iVar1 + iVar2 + iVar3);
  pcVar4 = Abc_UtilStrsav(pAig->pName);
  p_00->pName = pcVar4;
  pAVar5 = Aig_ManConst1(p_00);
  pAVar6 = Aig_ManConst1(pAig);
  (pAVar6->field_5).pData = pAVar5;
  for (Lit = 0; iVar1 = Vec_PtrSize(pAig->vCis), Lit < iVar1; Lit = Lit + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCis,Lit);
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (Lit = 0; iVar1 = Vec_PtrSize(pAig->vObjs), Lit < iVar1; Lit = Lit + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,Lit);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar5), iVar1 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p_00,pAVar6,p1);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  Lit = 0;
  do {
    iVar1 = Vec_VecSize(vReg2Value);
    if (iVar1 <= Lit) {
      for (Lit = 0; iVar1 = Saig_ManRegNum(pAig), Lit < iVar1; Lit = Lit + 1) {
        p = pAig->vCos;
        iVar1 = Saig_ManPoNum(pAig);
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p,Lit + iVar1);
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        Aig_ObjCreateCo(p_00,pAVar5);
      }
      Aig_ManCleanup(p_00);
      iVar1 = Aig_ManRegNum(pAig);
      Aig_ManSetRegNum(p_00,iVar1);
      return p_00;
    }
    p_01 = Vec_VecEntryInt(vReg2Value,Lit);
    if (Lit != 0) {
      _k = Aig_ManConst1(p_00);
      for (local_40 = 0; iVar1 = Vec_IntSize(p_01), local_40 < iVar1; local_40 = local_40 + 1) {
        iVar1 = Vec_IntEntry(p_01,local_40);
        if ((iVar1 < 0) ||
           (iVar2 = Aig_ManRegNum(pAig), SBORROW4(iVar1,iVar2 * 2) == iVar1 + iVar2 * -2 < 0)) {
          __assert_fail("Lit >= 0 && Lit < 2 * Aig_ManRegNum(pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin1.c"
                        ,0x208,"Aig_Man_t *Saig_ManCexMinDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
        }
        iVar2 = Abc_Lit2Var(iVar1);
        pAVar5 = Saig_ManLi(pAig,iVar2);
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        iVar1 = Abc_LitIsCompl(iVar1);
        pAVar5 = Aig_NotCond(pAVar5,iVar1);
        _k = Aig_And(p_00,_k,pAVar5);
      }
      Aig_ObjCreateCo(p_00,_k);
    }
    Lit = Lit + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCexMinDupWithCubes( Aig_Man_t * pAig, Vec_Vec_t * vReg2Value )
{
    Vec_Int_t * vLevel;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i, k, Lit;
    assert( pAig->nConstrs == 0 );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) + Vec_VecSizeSize(vReg2Value) + Vec_VecSize(vReg2Value) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs for cubes
    Vec_VecForEachLevelInt( vReg2Value, vLevel, i )
    {
        if ( i == 0 )
            continue;
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vLevel, Lit, k )
        {
            assert( Lit >= 0 && Lit < 2 * Aig_ManRegNum(pAig) );
            pObj = Saig_ManLi( pAig, Abc_Lit2Var(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, Aig_NotCond(Aig_ObjChild0Copy(pObj), Abc_LitIsCompl(Lit)) );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}